

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskContainer.cpp
# Opt level: O1

vector<IContainedElement_*,_std::allocator<IContainedElement_*>_> * __thiscall
DataContainer::GetFileList
          (vector<IContainedElement_*,_std::allocator<IContainedElement_*>_> *__return_storage_ptr__
          ,DataContainer *this)

{
  pointer *pppIVar1;
  iterator __position;
  int iVar2;
  pointer __args;
  
  (__return_storage_ptr__->
  super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __args = (this->file_list_).
           super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (__args < (this->file_list_).
               super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>._M_impl
               .super__Vector_impl_data._M_finish) {
    do {
      iVar2 = (*(*__args)->_vptr_IContainedElement[2])();
      if (iVar2 != 0) {
        __position._M_current =
             (__return_storage_ptr__->
             super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->
            super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<IContainedElement*,std::allocator<IContainedElement*>>::
          _M_realloc_insert<IContainedElement*const&>
                    ((vector<IContainedElement*,std::allocator<IContainedElement*>> *)
                     __return_storage_ptr__,__position,__args);
        }
        else {
          *__position._M_current = *__args;
          pppIVar1 = &(__return_storage_ptr__->
                      super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>)
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppIVar1 = *pppIVar1 + 1;
        }
      }
      __args = __args + 1;
    } while (__args < (this->file_list_).
                      super__Vector_base<IContainedElement_*,_std::allocator<IContainedElement_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<IContainedElement*> DataContainer::GetFileList()
{
   std::vector<IContainedElement*> out_list;

   //
   for (std::vector<IContainedElement*>::iterator it = file_list_.begin(); it < file_list_.end(); ++it)
   {
      if ((*it)->GetType() != 0)
      {
         out_list.push_back(*it);
      }
   }

   return out_list;
}